

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::InsertUniqueInTree
          (iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  LogMessage *other;
  void **ppvVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>_>,_bool>
  pVar2;
  LogFinisher local_61;
  Node *local_60;
  Node *local_58;
  
  ppvVar1 = this->table_;
  if (ppvVar1[b] != ppvVar1[b ^ 1]) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x364);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_60,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_60);
    ppvVar1 = this->table_;
  }
  node->next = (Node *)0x0;
  local_60 = node;
  local_58 = node;
  pVar2 = std::
          _Rb_tree<std::reference_wrapper<std::__cxx11::string_const>,std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
          ::
          _M_insert_unique<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>
                    ((_Rb_tree<std::reference_wrapper<std::__cxx11::string_const>,std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>,std::_Select1st<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>,google::protobuf::internal::TransparentSupport<std::__cxx11::string>::less,google::protobuf::internal::MapAllocator<std::pair<std::reference_wrapper<std::__cxx11::string_const>const,void*>>>
                      *)ppvVar1[b],
                     (pair<const_std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void_*>
                      *)&local_60);
  iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  ::iterator_base(__return_storage_ptr__,(_Base_ptr)pVar2.first._M_node,this,b & 0xfffffffffffffffe)
  ;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is null for all Nodes in Trees.
      node->next = nullptr;
      return iterator(
          static_cast<Tree*>(table_[b])->insert({node->kv.first, node}).first,
          this, b & ~static_cast<size_t>(1));
    }